

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::DividedBy<int,int,int>>,int>
               (View<int,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
               *expression)

{
  long *plVar1;
  CoordinateOrder CVar2;
  View<int,_true,_std::allocator<unsigned_long>_> *this;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  runtime_error *prVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  pointer puVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_c1;
  View<int,_true,_std::allocator<unsigned_long>_> *local_c0;
  View<int,_true,_std::allocator<unsigned_long>_> *local_b8;
  View<int,_false,_std::allocator<unsigned_long>_> *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  reference local_90;
  reference local_88;
  ulong local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_50;
  long local_48;
  
  if (((v->geometry_).size_ == 0) ||
     ((expression->e2_->geometry_).size_ == 0 && (expression->e1_->geometry_).size_ == 0)) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Assertion failed.");
  }
  else {
    sVar8 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
            ::dimension(expression);
    if (v->data_ == (pointer)0x0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"Assertion failed.");
    }
    else {
      sVar9 = (v->geometry_).dimension_;
      if (sVar8 == sVar9) {
        if (sVar9 == 0) {
          if ((v->geometry_).size_ == 1) {
            uVar19 = (expression->e1_->geometry_).size_;
            uVar14 = (expression->e2_->geometry_).size_;
            if (uVar14 < uVar19) {
              uVar14 = uVar19;
            }
            if (uVar14 == 1) {
LAB_00210f97:
              bVar7 = BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::DividedBy<int,int,int>>
                      ::overlaps<int,false,std::allocator<unsigned_long>>
                                ((BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::DividedBy<int,int,int>>
                                  *)expression,v);
              if (bVar7) {
                Marray<int,std::allocator<unsigned_long>>::
                Marray<andres::BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::DividedBy<int,int,int>>,int>
                          ((Marray<int,std::allocator<unsigned_long>> *)&local_78,
                           (ViewExpression<andres::BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>,_int>
                            *)expression,&local_c1);
                operate<andres::marray_detail::Assign<int,int>,int,int,false,std::allocator<unsigned_long>>
                          (v,&local_78);
                operator_delete((void *)CONCAT44(local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_),
                                local_48 << 2);
                uVar19 = local_50 * 0x18;
                puVar16 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00211292:
                operator_delete(puVar16,uVar19);
                return;
              }
              if (v->data_ == (int *)0x0) {
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar10,"Assertion failed.");
              }
              else {
                if ((v->geometry_).dimension_ == 0) {
                  *v->data_ = *expression->e1_->data_ / *expression->e2_->data_;
                  return;
                }
                View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
                if (((v->geometry_).isSimple_ == true) &&
                   (bVar7 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                            ::isSimple(expression), bVar7)) {
                  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
                  CVar2 = (v->geometry_).coordinateOrder_;
                  this = expression->e1_;
                  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this);
                  if (CVar2 == (this->geometry_).coordinateOrder_) {
                    sVar8 = (v->geometry_).size_;
                    if (sVar8 == 0) {
                      return;
                    }
                    piVar3 = v->data_;
                    piVar4 = expression->e1_->data_;
                    piVar5 = expression->e2_->data_;
                    sVar9 = 0;
                    do {
                      piVar3[sVar9] = piVar4[sVar9] / piVar5[sVar9];
                      sVar9 = sVar9 + 1;
                    } while (sVar8 != sVar9);
                    return;
                  }
                }
                local_b8 = expression->e1_;
                local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0;
                local_88 = AccessOperatorHelper<true>::
                           execute<int,int,true,std::allocator<unsigned_long>>
                                     (local_b8,(int *)&local_78);
                local_c0 = expression->e2_;
                local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0;
                local_90 = AccessOperatorHelper<true>::
                           execute<int,int,true,std::allocator<unsigned_long>>
                                     (local_c0,(int *)&local_78);
                if (v->data_ != (pointer)0x0) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            (&local_78,(v->geometry_).dimension_,(allocator_type *)&local_c1);
                  if (v->data_ == (pointer)0x0) {
                    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar10,"Assertion failed.");
                    __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_80 = (v->geometry_).dimension_ - 1;
                  lVar15 = 0;
                  lVar17 = 0;
                  lVar18 = 0;
                  local_b0 = v;
                  do {
                    v->data_[lVar18] = local_88[lVar15] / local_90[lVar17];
                    if (v->data_ == (pointer)0x0) {
LAB_002112c1:
                      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar10,"Assertion failed.");
                      __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    uVar19 = 0;
                    while (bVar7 = (v->geometry_).dimension_ <= uVar19, !bVar7) {
                      lVar6 = *(long *)(CONCAT44(local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_78.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       uVar19 * 8);
                      local_a8 = lVar18;
                      local_a0 = lVar17;
                      local_98 = lVar15;
                      sVar8 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,uVar19);
                      v = local_b0;
                      if (lVar6 + 1U != sVar8) {
                        sVar8 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                          (local_b0,uVar19);
                        sVar9 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                          (local_b8,uVar19);
                        sVar11 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                           (local_c0,uVar19);
                        plVar1 = (long *)(CONCAT44(local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         uVar19 * 8);
                        *plVar1 = *plVar1 + 1;
                        bVar7 = true;
                        lVar15 = local_98 + sVar9;
                        lVar17 = local_a0 + sVar11;
                        lVar18 = local_a8 + sVar8;
                        break;
                      }
                      lVar15 = local_98;
                      lVar17 = local_a0;
                      lVar18 = local_a8;
                      if (local_80 == uVar19) break;
                      lVar18 = *(long *)(CONCAT44(local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_78.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        uVar19 * 8);
                      sVar8 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                        (local_b0,uVar19);
                      sVar9 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                        (local_b8,uVar19);
                      sVar11 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                         (local_b8,uVar19);
                      sVar12 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                         (local_c0,uVar19);
                      sVar13 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                         (local_c0,uVar19);
                      lVar15 = local_98 - (sVar11 - 1) * sVar9;
                      lVar17 = local_a0 - (sVar13 - 1) * sVar12;
                      lVar18 = local_a8 - sVar8 * lVar18;
                      *(undefined8 *)
                       (CONCAT44(local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 8) = 0;
                      uVar19 = uVar19 + 1;
                      v = local_b0;
                      if (local_b0->data_ == (pointer)0x0) goto LAB_002112c1;
                    }
                  } while (bVar7);
                  puVar16 = (pointer)CONCAT44(local_78.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              local_78.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  if (puVar16 == (pointer)0x0) {
                    return;
                  }
                  uVar19 = (long)local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar16;
                  goto LAB_00211292;
                }
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar10,"Assertion failed.");
              }
              goto LAB_0021130f;
            }
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"Assertion failed.");
        }
        else {
          if (v->data_ != (pointer)0x0) {
            uVar19 = 0;
            do {
              if ((v->geometry_).dimension_ <= uVar19) goto LAB_00210f97;
              sVar8 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,uVar19);
              sVar9 = BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                      ::shape(expression,uVar19);
              if (sVar8 != sVar9) {
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar10,"Assertion failed.");
                goto LAB_0021130f;
              }
              uVar19 = uVar19 + 1;
            } while (v->data_ != (pointer)0x0);
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"Assertion failed.");
        }
      }
      else {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Assertion failed.");
      }
    }
  }
LAB_0021130f:
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}